

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPMT_TK_AUTH_Unmarshal(TPMT_TK_AUTH *target,BYTE **buffer,INT32 *size)

{
  TPM_RC result;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMT_TK_AUTH *target_local;
  
  target_local._4_4_ = UINT16_Unmarshal(&target->tag,buffer,size);
  if (target_local._4_4_ == 0) {
    if ((target->tag == 0x8025) || (target->tag == 0x8023)) {
      target_local._4_4_ = TPMI_RH_HIERARCHY_Unmarshal(&target->hierarchy,buffer,size,1);
      if (target_local._4_4_ == 0) {
        target_local._4_4_ = TPM2B_DIGEST_Unmarshal(&target->digest,buffer,size);
      }
    }
    else {
      target_local._4_4_ = 0x97;
    }
  }
  return target_local._4_4_;
}

Assistant:

TPM_RC
TPMT_TK_AUTH_Unmarshal(TPMT_TK_AUTH *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPM_ST_Unmarshal((TPM_ST *)&(target->tag), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    if( ((target->tag) != TPM_ST_AUTH_SIGNED)
     && ((target->tag) != TPM_ST_AUTH_SECRET))
        return TPM_RC_TAG;
    result = TPMI_RH_HIERARCHY_Unmarshal((TPMI_RH_HIERARCHY *)&(target->hierarchy), buffer, size, 1);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_DIGEST_Unmarshal((TPM2B_DIGEST *)&(target->digest), buffer, size);
    return result;
}